

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathPopString(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  xmlChar *ret;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr ctxt_local;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPatherror(ctxt,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                  ,0xbb2,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)xmlXPathCastToString(val);
    if ((xmlXPathParserContextPtr)val->stringval == ctxt_local) {
      val->stringval = (xmlChar *)0x0;
    }
    xmlXPathReleaseObject(ctxt->context,val);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlXPathPopString (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlChar * ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    ret = xmlXPathCastToString(obj);	/* this does required strdup */
    /* TODO: needs refactoring somewhere else */
    if (obj->stringval == ret)
	obj->stringval = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}